

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O2

IPGMContext * __thiscall
r_exec::IPGMContext::operator*(IPGMContext *__return_storage_ptr__,IPGMContext *this)

{
  Overlay **ppOVar1;
  PGMOverlay *pPVar2;
  Overlay *pOVar3;
  Data DVar4;
  undefined2 uVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  uint16_t uVar9;
  ushort uVar10;
  int iVar11;
  undefined4 extraout_var;
  Code *pCVar12;
  View *pVVar13;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  Atom *pAVar14;
  ushort unaff_BP;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  IPGMContext parent;
  Atom a;
  undefined4 uStack_8c;
  Atom *local_80;
  uint16_t local_78;
  Data local_74;
  Code *local_70;
  View *pVStack_68;
  uint16_t unused_index;
  
  cVar6 = r_code::Atom::getDescriptor();
  switch(cVar6) {
  case -0x7c:
    pAVar14 = (this->super__Context).code;
    pCVar12 = this->object;
    pVVar13 = this->view;
    parent.super__Context.index = r_code::Atom::asIndex();
    parent.super__Context.overlay = (this->super__Context).overlay;
    parent.super__Context.data = (this->super__Context).data;
    parent.super__Context.code = pAVar14;
    parent.object = pCVar12;
    parent.view = pVVar13;
    goto LAB_001720e0;
  case -0x7b:
    pCVar12 = this->object;
    uVar10 = r_code::Atom::asIndex();
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[9])(pCVar12,(ulong)uVar10);
    pCVar12 = (Code *)CONCAT44(extraout_var_02,iVar11);
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var_03,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    __return_storage_ptr__->object = pCVar12;
    __return_storage_ptr__->view = (View *)0x0;
    break;
  case -0x7a:
    pAVar14 = (this->super__Context).code;
    uVar10 = r_code::Atom::asIndex();
    _a = (undefined **)CONCAT44(uStack_8c,*(undefined4 *)(pAVar14 + (ulong)uVar10 * 4));
    cVar6 = r_code::Atom::getDescriptor();
    if (cVar6 == -0x7c) {
      pAVar14 = (this->super__Context).code;
      unaff_BP = r_code::Atom::asIndex();
      r_code::Atom::operator=(&a,pAVar14 + (ulong)unaff_BP * 4);
    }
    cVar6 = r_code::Atom::isStructural();
    if (cVar6 == '\0') {
      pCVar12 = this->object;
      pVVar13 = this->view;
      pAVar14 = (this->super__Context).code;
      parent.super__Context.index = r_code::Atom::asIndex();
      parent.super__Context.overlay = (this->super__Context).overlay;
      parent.super__Context.data = (this->super__Context).data;
      parent.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
      parent.super__Context.code = pAVar14;
      parent.object = pCVar12;
      parent.view = pVVar13;
      operator*(__return_storage_ptr__,&parent);
    }
    else {
      parent.super__Context.data = (this->super__Context).data;
      parent.super__Context.overlay = (this->super__Context).overlay;
      parent.super__Context.code = (this->super__Context).code;
      parent.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
      parent.object = this->object;
      parent.view = this->view;
      parent.super__Context.index = unaff_BP;
      bVar8 = evaluate_no_dereference(&parent,&unused_index);
      ppOVar1 = &(__return_storage_ptr__->super__Context).overlay;
      if (bVar8) {
        (__return_storage_ptr__->super__Context).index = parent.super__Context.index;
        *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
             parent.super__Context._26_2_;
        (__return_storage_ptr__->super__Context).data = parent.super__Context.data;
        *ppOVar1 = parent.super__Context.overlay;
        (__return_storage_ptr__->super__Context).code = parent.super__Context.code;
        uVar15 = parent.object._0_4_;
        uVar16 = parent.object._4_4_;
        uVar17 = parent.view._0_4_;
        uVar18 = parent.view._4_4_;
      }
      else {
        (__return_storage_ptr__->super__Context).index = 0;
        uVar15 = 0;
        uVar16 = 0;
        uVar17 = 0;
        uVar18 = 0;
        *ppOVar1 = (Overlay *)0x0;
        (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
        (__return_storage_ptr__->super__Context).data = UNDEFINED;
      }
      *(undefined4 *)&__return_storage_ptr__->object = uVar15;
      *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = uVar16;
      *(undefined4 *)&__return_storage_ptr__->view = uVar17;
      *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = uVar18;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001d0488;
    }
    r_code::Atom::~Atom(&a);
    break;
  case -0x79:
    pCVar12 = (Code *)(((this->super__Context).overlay)->controller->view->object).object;
    uVar9 = r_code::Atom::asIndex();
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    parent.super__Context.overlay = (Overlay *)0x0;
    parent.super__Context.data = REFERENCE;
    parent.view = (View *)0x0;
    parent.super__Context.code = (Atom *)CONCAT44(extraout_var_01,iVar11);
    parent.super__Context.index = uVar9;
    parent.object = pCVar12;
    goto LAB_001720e0;
  case -0x78:
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar7 = r_code::Atom::asInputIndex();
    pCVar12 = PGMOverlay::getInputObject(pPVar2,(ushort)bVar7);
    pPVar2 = (PGMOverlay *)(this->super__Context).overlay;
    bVar7 = r_code::Atom::asInputIndex();
    pVVar13 = (View *)PGMOverlay::getInputView(pPVar2,(ushort)bVar7);
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    parent.super__Context.index = r_code::Atom::asIndex();
    parent.super__Context.overlay = (Overlay *)0x0;
    parent.super__Context.data = REFERENCE;
    parent.super__Context.code = (Atom *)CONCAT44(extraout_var_00,iVar11);
    parent.object = pCVar12;
    parent.view = pVVar13;
LAB_001720e0:
    parent.super__Context._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    operator*(__return_storage_ptr__,&parent);
    break;
  case -0x77:
    pCVar12 = this->object;
    pVVar13 = this->view;
    pAVar14 = r_code::vector<r_code::Atom>::operator[](&((this->super__Context).overlay)->values,0);
    uVar9 = r_code::Atom::asIndex();
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = pAVar14;
    (__return_storage_ptr__->super__Context).index = uVar9;
    (__return_storage_ptr__->super__Context).data = VALUE_ARRAY;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    local_d8 = SUB84(pCVar12,0);
    uStack_d4 = (undefined4)((ulong)pCVar12 >> 0x20);
    uStack_d0 = SUB84(pVVar13,0);
    uStack_cc = (undefined4)((ulong)pVVar13 >> 0x20);
    parent.object._0_4_ = local_d8;
    parent.object._4_4_ = uStack_d4;
    parent.view._0_4_ = uStack_d0;
    parent.view._4_4_ = uStack_cc;
    goto LAB_0017236e;
  case -0x76:
    pOVar3 = (this->super__Context).overlay;
    uVar10 = r_code::Atom::asIndex();
    IPGMContext(__return_storage_ptr__,(Code *)pOVar3[1].super__Object._vptr__Object[uVar10],0);
    break;
  case -0x75:
  case -0x73:
  case -0x72:
  case -0x71:
switchD_00171df5_caseD_8b:
    uVar5 = *(undefined2 *)&(this->super__Context).field_0x1a;
    DVar4 = (this->super__Context).data;
    (__return_storage_ptr__->super__Context).index = (this->super__Context).index;
    *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a = uVar5;
    (__return_storage_ptr__->super__Context).data = DVar4;
    uVar15 = *(undefined4 *)&(this->super__Context).overlay;
    uVar16 = *(undefined4 *)((long)&(this->super__Context).overlay + 4);
    uVar17 = *(undefined4 *)&(this->super__Context).code;
    uVar18 = *(undefined4 *)((long)&(this->super__Context).code + 4);
    goto LAB_00172357;
  case -0x74:
    r_code::Atom::asRelativeIndex();
    _a = &PTR___Context_001d0488;
    operator*(&parent,(IPGMContext *)&a);
    (*((parent.object)->super__Object)._vptr__Object[4])(parent.object,0);
    r_code::Atom::asIndex();
    _a = &PTR___Context_001d0488;
    operator*(__return_storage_ptr__,(IPGMContext *)&a);
    break;
  case -0x70:
    pVVar13 = (View *)((this->super__Context).overlay)->controller->view;
    pCVar12 = (Code *)(pVVar13->super_View).object.object;
    iVar11 = (*(pCVar12->super__Object)._vptr__Object[4])(pCVar12,0);
    (__return_storage_ptr__->super__Context).overlay = (this->super__Context).overlay;
    (__return_storage_ptr__->super__Context).code = (Atom *)CONCAT44(extraout_var,iVar11);
    (__return_storage_ptr__->super__Context).index = 0;
    (__return_storage_ptr__->super__Context).data = REFERENCE;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    __return_storage_ptr__->object = pCVar12;
    __return_storage_ptr__->view = pVVar13;
    break;
  case -0x6f:
    pOVar3 = (this->super__Context).overlay;
    if ((pOVar3 != (Overlay *)0x0) &&
       (pCVar12 = this->object, pCVar12 == (Code *)(pOVar3->controller->view->object).object)) {
      pVVar13 = this->view;
      (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
      (__return_storage_ptr__->super__Context).code = (Atom *)&(pVVar13->super_View).field_0x28;
      (__return_storage_ptr__->super__Context).index = 0;
      (__return_storage_ptr__->super__Context).data = VIEW;
      (__return_storage_ptr__->super__Context)._vptr__Context =
           (_func_int **)&PTR___Context_001d0488;
      __return_storage_ptr__->object = pCVar12;
      __return_storage_ptr__->view = pVVar13;
      return __return_storage_ptr__;
    }
    uVar5 = *(undefined2 *)&(this->super__Context).field_0x1a;
    DVar4 = (this->super__Context).data;
    (__return_storage_ptr__->super__Context).index = (this->super__Context).index;
    *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a = uVar5;
    (__return_storage_ptr__->super__Context).data = DVar4;
    uVar15 = *(undefined4 *)&(this->super__Context).overlay;
    uVar16 = *(undefined4 *)((long)&(this->super__Context).overlay + 4);
    uVar17 = *(undefined4 *)&(this->super__Context).code;
    uVar18 = *(undefined4 *)((long)&(this->super__Context).code + 4);
LAB_00172357:
    *(undefined4 *)&(__return_storage_ptr__->super__Context).overlay = uVar15;
    *(undefined4 *)((long)&(__return_storage_ptr__->super__Context).overlay + 4) = uVar16;
    *(undefined4 *)&(__return_storage_ptr__->super__Context).code = uVar17;
    *(undefined4 *)((long)&(__return_storage_ptr__->super__Context).code + 4) = uVar18;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
    parent.object._0_4_ = *(undefined4 *)&this->object;
    parent.object._4_4_ = *(undefined4 *)((long)&this->object + 4);
    parent.view._0_4_ = *(undefined4 *)&this->view;
    parent.view._4_4_ = *(undefined4 *)((long)&this->view + 4);
    goto LAB_0017236e;
  case -0x6e:
    pCVar12 = this->object;
    DVar4 = MKS;
    goto LAB_001721b1;
  case -0x6d:
    pCVar12 = this->object;
    DVar4 = VWS;
LAB_001721b1:
    IPGMContext(__return_storage_ptr__,pCVar12,DVar4);
    break;
  default:
    if (cVar6 != -0x40) goto switchD_00171df5_caseD_8b;
    getChild((IPGMContext *)&a,this,1);
    operator*(&parent,(IPGMContext *)&a);
    for (uVar10 = 2; iVar11 = (*(this->super__Context)._vptr__Context[6])(this),
        uVar10 <= (ushort)iVar11; uVar10 = uVar10 + 1) {
      cVar6 = r_code::Atom::getDescriptor();
      if (cVar6 == -0x6f) {
        if (parent.view == (View *)0x0) {
          parent.object._0_4_ = 0;
          parent.object._4_4_ = 0;
          parent.view._0_4_ = 0;
          parent.view._4_4_ = 0;
          (__return_storage_ptr__->super__Context).overlay = (Overlay *)0x0;
          (__return_storage_ptr__->super__Context).code = (Atom *)0x0;
          (__return_storage_ptr__->super__Context).index = 0;
          (__return_storage_ptr__->super__Context).data = UNDEFINED;
          (__return_storage_ptr__->super__Context)._vptr__Context =
               (_func_int **)&PTR___Context_001d0488;
          goto LAB_0017236e;
        }
        parent.super__Context.code = (Atom *)&((parent.view)->super_View).field_0x28;
        parent.super__Context.index = 0;
        parent.super__Context.data = VIEW;
      }
      else {
        if (cVar6 == -0x6e) {
          DVar4 = MKS;
LAB_0017245b:
          IPGMContext(__return_storage_ptr__,parent.object,DVar4);
          return __return_storage_ptr__;
        }
        if (cVar6 == -0x6d) {
          DVar4 = VWS;
          goto LAB_0017245b;
        }
        uVar9 = r_code::Atom::asIndex();
        getChild((IPGMContext *)&unused_index,&parent,uVar9);
        operator*((IPGMContext *)&a,(IPGMContext *)&unused_index);
        parent.object = local_70;
        parent.view = pVStack_68;
        parent.super__Context.code = local_80;
        parent.super__Context.index = local_78;
        parent.super__Context.data = local_74;
      }
    }
    (__return_storage_ptr__->super__Context).index = parent.super__Context.index;
    *(undefined2 *)&(__return_storage_ptr__->super__Context).field_0x1a =
         parent.super__Context._26_2_;
    (__return_storage_ptr__->super__Context).data = parent.super__Context.data;
    (__return_storage_ptr__->super__Context).overlay = parent.super__Context.overlay;
    (__return_storage_ptr__->super__Context).code = parent.super__Context.code;
    (__return_storage_ptr__->super__Context)._vptr__Context = (_func_int **)&PTR___Context_001d0488;
LAB_0017236e:
    *(undefined4 *)&__return_storage_ptr__->object = parent.object._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->object + 4) = parent.object._4_4_;
    *(undefined4 *)&__return_storage_ptr__->view = parent.view._0_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->view + 4) = parent.view._4_4_;
  }
  return __return_storage_ptr__;
}

Assistant:

IPGMContext IPGMContext::operator *() const
{
    switch ((*this)[0].getDescriptor()) {
    case Atom::VL_PTR: { // evaluate the code if necessary.
        // TODO: OPTIMIZATION: if not in a cptr and if this eventually points to an r-ptr or in-obj-ptr,
        // patch the code at this->index, i.e. replace the vl ptr by the in-obj-ptr or rptr.
        Atom a = code[(*this)[0].asIndex()];
        uint16_t structure_index;

        if (a.getDescriptor() == Atom::I_PTR) { // dereference once.
            a = code[structure_index = a.asIndex()];
        }

        if (a.isStructural()) { // the target location is not evaluated yet.
            IPGMContext s(object, view, code, structure_index, (InputLessPGMOverlay *)overlay, data);
            uint16_t unused_index;

            if (s.evaluate_no_dereference(unused_index)) {
                return s;    // patched code: atom at VL_PTR's index changed to VALUE_PTR or 32 bits result.
            } else { // evaluation failed, return undefined context.
                return IPGMContext();
            }
        } else {
            return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);
        }
    }

    case Atom::I_PTR:
        return *IPGMContext(object, view, code, (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, data);

    case Atom::R_PTR: {
        Code *o = object->get_reference((*this)[0].asIndex());
        return IPGMContext(o, nullptr, &o->code(0), 0, nullptr, REFERENCE);
    }

    case Atom::C_PTR: {
        IPGMContext c = *getChild(1);

        for (uint16_t i = 2; i <= getChildrenCount(); ++i) {
            switch ((*this)[i].getDescriptor()) {
            case Atom::VIEW: // accessible only for this and input objects.
                if (c.view) {
                    c = IPGMContext(c.getObject(), c.view, &c.view->code(0), 0, nullptr, VIEW);
                } else {
                    return IPGMContext();
                }

                break;

            case Atom::MKS:
                return IPGMContext(c.getObject(), MKS);
                break;

            case Atom::VWS:
                return IPGMContext(c.getObject(), VWS);
                break;

            default:
                c = *c.getChild((*this)[i].asIndex());
            }
        }

        return c;
    }

    case Atom::THIS: // refers to the ipgm; the pgm view is not available.
        return IPGMContext(overlay->getObject(), overlay->getView(), &overlay->getObject()->code(0), 0, (InputLessPGMOverlay *)overlay, REFERENCE);

    case Atom::VIEW: // never a reference, always in a cptr.
        if (overlay && object == overlay->getObject()) {
            return IPGMContext(object, view, &view->code(0), 0, nullptr, VIEW);
        }

        return *this;

    case Atom::MKS:
        return IPGMContext(object, MKS);

    case Atom::VWS:
        return IPGMContext(object, VWS);

    case Atom::VALUE_PTR:
        return IPGMContext(object, view, &overlay->values[0], (*this)[0].asIndex(), (InputLessPGMOverlay *)overlay, VALUE_ARRAY);

    case Atom::IPGM_PTR:
        return *IPGMContext(overlay->getObject(), (*this)[0].asIndex());

    case Atom::IN_OBJ_PTR: {
        Code *input_object = ((PGMOverlay *)overlay)->getInputObject((*this)[0].asInputIndex());
        View *input_view = (r_exec::View*)((PGMOverlay *)overlay)->getInputView((*this)[0].asInputIndex());
        return *IPGMContext(input_object, input_view, &input_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::D_IN_OBJ_PTR: {
        IPGMContext parent = *IPGMContext(object, view, code, (*this)[0].asRelativeIndex(), (InputLessPGMOverlay *)overlay, data);
        Code *parent_object = parent.object;
        return *IPGMContext(parent_object, nullptr, &parent_object->code(0), (*this)[0].asIndex(), nullptr, REFERENCE);
    }

    case Atom::PROD_PTR:
        return IPGMContext(((InputLessPGMOverlay *)overlay)->productions[(*this)[0].asIndex()], 0);

    default:
        return *this;
    }
}